

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<16U,_float>,_basisu::weighted_block_group>,_false,_true>_>
* __thiscall
basisu::
vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<16U,_float>,_basisu::weighted_block_group>,_false,_true>_>
::operator=(vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<16U,_float>,_basisu::weighted_block_group>,_false,_true>_>
            *this,vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<16U,_float>,_basisu::weighted_block_group>,_false,_true>_>
                  *other)

{
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    if ((this->m_p !=
         (_Node_const_iterator<std::pair<const_basisu::vec<16U,_float>,_basisu::weighted_block_group>,_false,_true>
          *)0x0) &&
       (other->m_p !=
        (_Node_const_iterator<std::pair<const_basisu::vec<16U,_float>,_basisu::weighted_block_group>,_false,_true>
         *)0x0)) {
      memcpy(this->m_p,other->m_p,(ulong)other->m_size << 3);
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }